

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O0

RealType RosenD(int m,int n,int p)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double dVar3;
  int k;
  RealType RosenD_;
  int local_24;
  int local_20;
  int local_1c;
  RealType local_18;
  int local_c;
  int local_8;
  int local_4;
  
  if (0x97 < in_EDI + in_ESI + in_EDX) {
    printf("Error, arguments exceed maximum factorial computed %d > %d\n",
           (ulong)(uint)(in_EDI + in_ESI + in_EDX),0x97);
    exit(0);
  }
  local_18 = 0.0;
  local_20 = in_EDX - in_EDI;
  local_24 = 0;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  piVar2 = std::max<int>(&local_20,&local_24);
  local_1c = *piVar2;
  while( true ) {
    iVar1 = local_1c;
    piVar2 = std::min<int>(&local_8,&local_c);
    if (*piVar2 < iVar1) break;
    iVar1 = mod<int>(local_1c,2);
    if (iVar1 == 0) {
      dVar3 = (fact[local_4] / (fact[local_c - local_1c] * fact[(local_4 - local_c) + local_1c])) *
              (fact[local_8] / (fact[local_8 - local_1c] * fact[local_1c]));
    }
    else {
      dVar3 = -(fact[local_4] / (fact[local_c - local_1c] * fact[(local_4 - local_c) + local_1c])) *
              (fact[local_8] / (fact[local_8 - local_1c] * fact[local_1c]));
    }
    local_18 = dVar3 + local_18;
    local_1c = local_1c + 1;
  }
  return local_18;
}

Assistant:

inline RealType RosenD(int m, int n, int p) {
  if (m + n + p > maxFact) {
    printf("Error, arguments exceed maximum factorial computed %d > %d\n",
           m + n + p, maxFact);
    ::exit(0);
  }

  RealType RosenD_ = 0;
  for (int k = max(p - m, 0); k <= min(n, p); k++) {
    if (mod(k, 2) == 0)
      RosenD_ += (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
    else
      RosenD_ -= (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
  }
  return RosenD_;
}